

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

_Bool ssh1_common_get_specials(PacketProtocolLayer *ppl,add_special_fn_t add_special,void *ctx)

{
  uint uVar1;
  
  uVar1 = ppl->remote_bugs;
  if ((uVar1 & 1) == 0) {
    (*add_special)(ctx,"IGNORE message",SS_NOP,0);
  }
  return (uVar1 & 1) == 0;
}

Assistant:

bool ssh1_common_get_specials(
    PacketProtocolLayer *ppl, add_special_fn_t add_special, void *ctx)
{
    /*
     * Don't bother offering IGNORE if we've decided the remote
     * won't cope with it, since we wouldn't bother sending it if
     * asked anyway.
     */
    if (!(ppl->remote_bugs & BUG_CHOKES_ON_SSH1_IGNORE)) {
        add_special(ctx, "IGNORE message", SS_NOP, 0);
        return true;
    }

    return false;
}